

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# closure.c
# Opt level: O2

void set_EFF(void)

{
  Yshort *pYVar1;
  Yshort *pYVar2;
  Yshort **ppYVar3;
  int iVar4;
  uint *R;
  int iVar5;
  long lVar6;
  int *piVar7;
  uint *puVar8;
  
  iVar4 = (nvars + 0x1f) / 0x20;
  R = (uint *)allocate(nvars * iVar4 * 4);
  ppYVar3 = derives;
  puVar8 = R;
  EFF = R;
  for (lVar6 = (long)start_symbol; pYVar2 = rrhs, pYVar1 = ritem, lVar6 < nsyms; lVar6 = lVar6 + 1)
  {
    for (piVar7 = ppYVar3[lVar6]; 0 < (long)*piVar7; piVar7 = piVar7 + 1) {
      iVar5 = pYVar1[pYVar2[*piVar7]] - start_symbol;
      if (start_symbol <= pYVar1[pYVar2[*piVar7]]) {
        puVar8[iVar5 >> 5] = puVar8[iVar5 >> 5] | 1 << ((byte)iVar5 & 0x1f);
      }
    }
    puVar8 = puVar8 + iVar4;
  }
  reflexive_transitive_closure(R,nvars);
  return;
}

Assistant:

void set_EFF()
{
    register unsigned *row;
    register int symbol;
    register Yshort *sp;
    register int rowsize;
    register int i;
    register int rule;

    rowsize = WORDSIZE(nvars);
    EFF = NEW2(nvars * rowsize, unsigned);

    row = EFF;
    for (i = start_symbol; i < nsyms; i++)
    {
	sp = derives[i];
	for (rule = *sp; rule > 0; rule = *++sp)
	{
	    symbol = ritem[rrhs[rule]];
	    if (ISVAR(symbol))
	    {
		symbol -= start_symbol;
		SETBIT(row, symbol);
	    }
	}
	row += rowsize;
    }

    reflexive_transitive_closure(EFF, nvars);

#ifdef	DEBUG
    print_EFF();
#endif
}